

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  u8 uVar1;
  u8 eMode;
  uint uVar2;
  uint p1;
  sqlite3 *db;
  Schema *pSVar3;
  ushort nPk;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Table *pTab;
  Trigger *pTVar8;
  Vdbe *p;
  WhereInfo *pWInfo;
  char *pcVar9;
  Parse *pPVar10;
  int p2;
  Schema **ppSVar11;
  Op *pOVar12;
  VTable *zP4;
  int op;
  Index *pIVar13;
  Expr *pLimit_00;
  int in_R9D;
  Parse *pPVar14;
  u8 *aToOpen;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  int local_f8;
  uint local_e8;
  Index *local_c0;
  int iDataCur;
  ulong local_b0;
  char *local_a8;
  int local_a0;
  int iIdxCur;
  Expr *local_98;
  int local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  Trigger *local_70;
  NameContext sNC;
  
  pPVar14 = (Parse *)0x0;
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  local_98 = pWhere;
  if (pParse->nErr != 0) {
    aToOpen = (u8 *)0x0;
    pcVar9 = (char *)0x0;
    goto LAB_0015a851;
  }
  pTab = sqlite3SrcListLookup(pParse,pTabList);
  if (pTab != (Table *)0x0) {
    pTVar8 = sqlite3TriggersExist(pParse,pTab,0x80,(ExprList *)0x0,(int *)0x0);
    uVar1 = pTab->eTabType;
    bVar17 = true;
    if (pTVar8 == (Trigger *)0x0) {
      iVar4 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0);
      bVar17 = iVar4 != 0;
    }
    iVar4 = sqlite3ViewGetColumnNames(pParse,pTab);
    if ((iVar4 == 0) &&
       (iVar4 = sqlite3IsReadOnly(pParse,pTab,(uint)(pTVar8 != (Trigger *)0x0)), iVar4 == 0)) {
      if (pTab->pSchema == (Schema *)0x0) {
        iVar4 = -0x8000;
      }
      else {
        iVar4 = -1;
        ppSVar11 = &db->aDb->pSchema;
        do {
          iVar4 = iVar4 + 1;
          pSVar3 = *ppSVar11;
          ppSVar11 = ppSVar11 + 4;
        } while (pSVar3 != pTab->pSchema);
      }
      pLimit_00 = (Expr *)db->aDb[iVar4].zDbSName;
      uVar16 = 0;
      local_70 = pTVar8;
      iVar5 = sqlite3AuthCheck(pParse,9,pTab->zName,(char *)0x0,(char *)pLimit_00);
      pPVar14 = (Parse *)0x0;
      aToOpen = (u8 *)0x0;
      pcVar9 = (char *)0x0;
      if (iVar5 == 1) goto LAB_0015a851;
      uVar2 = pParse->nTab;
      local_b0 = (ulong)uVar2;
      pParse->nTab = uVar2 + 1;
      pTabList->a[0].iCursor = uVar2;
      pIVar13 = pTab->pIndex;
      if (pIVar13 != (Index *)0x0) {
        uVar16 = 0;
        do {
          uVar16 = uVar16 + 1;
          pIVar13 = pIVar13->pNext;
        } while (pIVar13 != (Index *)0x0);
        pParse->nTab = pParse->nTab + uVar16;
      }
      if (uVar1 == '\x02') {
        local_a8 = pParse->zAuthContext;
        pParse->zAuthContext = pTab->zName;
        pPVar14 = pParse;
      }
      else {
        pPVar14 = (Parse *)0x0;
        local_a8 = (char *)0x0;
      }
      p = sqlite3GetVdbe(pParse);
      if (p != (Vdbe *)0x0) {
        if (pParse->nested == '\0') {
          p->field_0xc6 = p->field_0xc6 | 0x10;
        }
        sqlite3BeginWriteOperation(pParse,(uint)bVar17,iVar4);
        if (uVar1 == '\x02') {
          iVar6 = (int)local_b0;
          sqlite3MaterializeView
                    (pParse,pTab,local_98,(ExprList *)(local_b0 & 0xffffffff),pLimit_00,in_R9D);
          iDataCur = iVar6;
          iIdxCur = iVar6;
        }
        sNC.nRef = 0;
        sNC.nNcErr = 0;
        sNC.ncFlags = 0;
        sNC._44_4_ = 0;
        sNC.uNC.pEList = (ExprList *)0x0;
        sNC.pNext = (NameContext *)0x0;
        sNC.pWinSelect = (Select *)0x0;
        sNC.pParse = pParse;
        sNC.pSrcList = pTabList;
        iVar6 = sqlite3ResolveExprNames(&sNC,local_98);
        if (iVar6 == 0) {
          if ((db->flags & 0x100000000) == 0) {
            local_e8 = 0;
          }
          else if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
            local_e8 = 0;
            if (pParse->bReturning == '\0') {
              local_e8 = pParse->nMem + 1;
              pParse->nMem = local_e8;
              sqlite3VdbeAddOp3(p,0x47,0,local_e8,0);
            }
          }
          else {
            local_e8 = 0;
          }
          if (((local_98 == (Expr *)0x0 && iVar5 == 0) && bVar17 == false) &&
             (pTab->eTabType != '\x01')) {
            sqlite3TableLock(pParse,iVar4,pTab->tnum,'\x01',pTab->zName);
            if ((pTab->tabFlags & 0x80) == 0) {
              pcVar9 = pTab->zName;
              iVar5 = sqlite3VdbeAddOp3(p,0x91,pTab->tnum,iVar4,-(uint)(local_e8 == 0) | local_e8);
              sqlite3VdbeChangeP4(p,iVar5,pcVar9,-1);
            }
            pIVar13 = pTab->pIndex;
            aToOpen = (u8 *)0x0;
            if (pIVar13 != (Index *)0x0) {
              do {
                sqlite3VdbeAddOp3(p,0x91,pIVar13->tnum,iVar4,0);
                if (((*(ushort *)&pIVar13->field_0x63 & 3) == 2) && ((pTab->tabFlags & 0x80) != 0))
                {
                  pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (p->db->mallocFailed == '\0') {
                    pOVar12 = p->aOp + (long)p->nOp + -1;
                  }
                  pOVar12->p3 = -(uint)(local_e8 == 0) | local_e8;
                }
                pIVar13 = pIVar13->pNext;
              } while (pIVar13 != (Index *)0x0);
            }
          }
          else {
            uVar15 = sNC._40_8_ & 0x40;
            if ((pTab->tabFlags & 0x80) == 0) {
              local_a0 = pParse->nMem + 1;
              pParse->nMem = local_a0;
              local_c0 = (Index *)0x0;
              sqlite3VdbeAddOp3(p,0x4b,0,local_a0,0);
              nPk = 1;
              local_f8 = 0;
              local_88 = 0;
              local_8c = 0;
            }
            else {
              for (local_c0 = pTab->pIndex;
                  (local_c0 != (Index *)0x0 && ((*(ushort *)&local_c0->field_0x63 & 3) != 2));
                  local_c0 = local_c0->pNext) {
              }
              nPk = local_c0->nKeyCol;
              p1 = pParse->nTab;
              local_88 = (ulong)p1;
              local_f8 = pParse->nMem + 1;
              pParse->nMem = pParse->nMem + (int)(short)nPk;
              pParse->nTab = p1 + 1;
              local_a0 = 0;
              local_8c = sqlite3VdbeAddOp3(p,0x76,p1,(int)(short)nPk,0);
              sqlite3VdbeSetP4KeyInfo(pParse,local_c0);
            }
            iVar4 = local_f8;
            pWInfo = sqlite3WhereBegin(pParse,pTabList,local_98,(ExprList *)0x0,(ExprList *)0x0,
                                       (Select *)0x0,
                                       (ushort)(uVar15 == 0 & (bVar17 ^ 1U)) * 8 + 0x14,uVar2 + 1);
            if (pWInfo == (WhereInfo *)0x0) {
LAB_0015af93:
              aToOpen = (u8 *)0x0;
              bVar17 = false;
            }
            else {
              local_78 = *(ulong *)pWInfo->aiCurOnePass;
              eMode = pWInfo->eOnePass;
              if (eMode != '\x01') {
                pPVar10 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar10 = pParse;
                }
                pPVar10->isMultiWrite = '\x01';
              }
              if ((pWInfo->field_0x4c & 1) != 0) {
                sqlite3VdbeAddOp3(p,0x8f,(int)local_b0,0,0);
              }
              if (local_e8 != 0) {
                sqlite3VdbeAddOp3(p,0x56,local_e8,1,0);
              }
              local_80 = local_78 >> 0x20;
              iVar5 = (int)local_b0;
              if (local_c0 == (Index *)0x0) {
                local_f8 = pParse->nMem + 1;
                pParse->nMem = local_f8;
                sqlite3VdbeAddOp3(p,0x87,iVar5,local_f8,0);
              }
              else if (0 < (short)nPk) {
                uVar15 = 0;
                do {
                  sqlite3ExprCodeGetColumnOfTable
                            (p,pTab,iVar5,(int)local_c0->aiColumn[uVar15],local_f8 + (int)uVar15);
                  uVar15 = uVar15 + 1;
                } while (nPk != uVar15);
              }
              if (eMode == '\0') {
                if (local_c0 == (Index *)0x0) {
                  sqlite3VdbeAddOp3(p,0x9c,local_a0,local_f8,0);
                  nPk = 1;
                }
                else {
                  local_f8 = pParse->nMem + 1;
                  pParse->nMem = local_f8;
                  iVar5 = (int)(short)nPk;
                  pcVar9 = sqlite3IndexAffinityStr(pParse->db,local_c0);
                  iVar6 = sqlite3VdbeAddOp3(p,0x61,iVar4,iVar5,local_f8);
                  sqlite3VdbeChangeP4(p,iVar6,pcVar9,iVar5);
                  iVar4 = sqlite3VdbeAddOp3(p,0x8a,(int)local_88,local_f8,iVar4);
                  if (p->db->mallocFailed == '\0') {
                    pOVar12 = p->aOp;
                    pOVar12[iVar4].p4type = -3;
                    pOVar12[iVar4].p4.i = iVar5;
                  }
                  nPk = 0;
                }
                sqlite3WhereEnd(pWInfo);
                aToOpen = (u8 *)0x0;
                iVar5 = 0;
                iVar4 = (int)local_b0;
              }
              else {
                aToOpen = (u8 *)sqlite3DbMallocRawNN(db,(ulong)(uVar16 + 2));
                if (aToOpen == (u8 *)0x0) {
                  sqlite3WhereEnd(pWInfo);
                  goto LAB_0015af93;
                }
                memset(aToOpen,1,(ulong)uVar16 + 1);
                aToOpen[(ulong)uVar16 + 1] = '\0';
                iVar4 = (int)local_b0;
                if (-1 < (int)local_78) {
                  aToOpen[(int)local_78 - iVar4] = '\0';
                }
                if (-1 < (long)local_78) {
                  aToOpen[(int)local_80 - iVar4] = '\0';
                }
                if (local_8c != 0) {
                  sqlite3VdbeChangeToNoop(p,local_8c);
                }
                iVar5 = pParse->nLabel + -1;
                pParse->nLabel = iVar5;
              }
              if (uVar1 != '\x02') {
                iVar6 = 0;
                if (eMode == '\x02') {
                  iVar6 = sqlite3VdbeAddOp3(p,0xe,0,0,0);
                }
                sqlite3OpenTableAndIndices(pParse,pTab,0x71,'\b',iVar4,aToOpen,&iDataCur,&iIdxCur);
                if (eMode == '\x02') {
                  iVar7 = p->nOp + -1;
                  if (iVar7 == iVar6) {
                    p->nOp = iVar7;
                  }
                  else {
                    if (p->db->mallocFailed == '\0') {
                      if (-1 < iVar6) {
                        iVar7 = iVar6;
                      }
                      pOVar12 = p->aOp + iVar7;
                    }
                    else {
                      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
                    }
                    pOVar12->p2 = p->nOp;
                  }
                }
              }
              if (eMode == '\0') {
                if (local_c0 == (Index *)0x0) {
                  iVar6 = sqlite3VdbeAddOp3(p,0x2d,local_a0,0,local_f8);
                }
                else {
                  iVar4 = (int)local_88;
                  iVar6 = sqlite3VdbeAddOp3(p,0x23,iVar4,0,0);
                  if (pTab->eTabType == '\x01') {
                    op = 0x5e;
                    iVar7 = local_f8;
                    p2 = 0;
                  }
                  else {
                    op = 0x86;
                    iVar7 = 0;
                    p2 = local_f8;
                  }
                  sqlite3VdbeAddOp3(p,op,iVar4,p2,iVar7);
                  iVar4 = (int)local_b0;
                }
              }
              else if (pTab->eTabType == '\x01') {
                iVar6 = 0;
              }
              else {
                iVar6 = 0;
                if ((aToOpen[iDataCur - iVar4] != '\0') &&
                   (iVar7 = sqlite3VdbeAddOp3(p,0x1b,iDataCur,iVar5,local_f8),
                   p->db->mallocFailed == '\0')) {
                  pOVar12 = p->aOp;
                  pOVar12[iVar7].p4type = -3;
                  *(int *)&pOVar12[iVar7].p4 = (int)(short)nPk;
                }
              }
              if (pTab->eTabType == '\x01') {
                for (zP4 = (pTab->u).vtab.p; (zP4 != (VTable *)0x0 && (zP4->db != db));
                    zP4 = zP4->pNext) {
                }
                sqlite3VtabMakeWritable(pParse,pTab);
                pPVar10 = pParse->pToplevel;
                if (pParse->pToplevel == (Parse *)0x0) {
                  pPVar10 = pParse;
                }
                pPVar10->mayAbort = '\x01';
                if ((eMode == '\x01') &&
                   (sqlite3VdbeAddOp3(p,0x7a,iVar4,0,0), pParse->pToplevel == (Parse *)0x0)) {
                  pParse->isMultiWrite = '\0';
                }
                iVar4 = sqlite3VdbeAddOp3(p,7,0,1,local_f8);
                sqlite3VdbeChangeP4(p,iVar4,(char *)zP4,-0xb);
                if (0 < (long)p->nOp) {
                  p->aOp[(long)p->nOp + -1].p5 = 2;
                }
              }
              else {
                sqlite3GenerateRowDelete
                          (pParse,pTab,local_70,iDataCur,iIdxCur,local_f8,nPk,pParse->nested == '\0'
                           ,'\v',eMode,(int)local_80);
              }
              iVar4 = (int)local_88;
              if (eMode == '\0') {
                if (local_c0 == (Index *)0x0) {
                  iVar7 = 8;
                  iVar4 = 0;
                  iVar5 = iVar6;
                }
                else {
                  iVar7 = 0x26;
                  iVar5 = iVar6 + 1;
                }
                sqlite3VdbeAddOp3(p,iVar7,iVar4,iVar5,0);
                if (p->db->mallocFailed == '\0') {
                  iVar4 = p->nOp + -1;
                  if (-1 < iVar6) {
                    iVar4 = iVar6;
                  }
                  pOVar12 = p->aOp + iVar4;
                }
                else {
                  pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar12->p2 = p->nOp;
                bVar17 = true;
              }
              else {
                sqlite3VdbeResolveLabel(p,iVar5);
                sqlite3WhereEnd(pWInfo);
                bVar17 = true;
              }
            }
            pcVar9 = local_a8;
            if (!bVar17) goto LAB_0015a851;
          }
          if (((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) &&
             (pParse->pAinc != (AutoincInfo *)0x0)) {
            autoIncrementEnd(pParse);
          }
          pcVar9 = local_a8;
          if (local_e8 != 0) {
            sqlite3CodeChangeCount(p,local_e8,"rows deleted");
            pcVar9 = local_a8;
          }
          goto LAB_0015a851;
        }
      }
      aToOpen = (u8 *)0x0;
      pcVar9 = local_a8;
      goto LAB_0015a851;
    }
  }
  pPVar14 = (Parse *)0x0;
  aToOpen = (u8 *)0x0;
  pcVar9 = (char *)0x0;
LAB_0015a851:
  if (pPVar14 != (Parse *)0x0) {
    pPVar14->zAuthContext = pcVar9;
  }
  sqlite3SrcListDelete(db,pTabList);
  if (local_98 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,local_98);
  }
  if (aToOpen != (u8 *)0x0) {
    sqlite3DbFreeNN(db,aToOpen);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto delete_from_cleanup;
  }
  assert( db->mallocFailed==0 );
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = IsView(pTab);
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x10000 ){
    sqlite3TreeViewLine(0, "In sqlite3Delete() at %s:%d", __FILE__, __LINE__);
    sqlite3TreeViewDelete(pParse->pWith, pTabList, pWhere,
                          pOrderBy, pLimit, pTrigger);
  }
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, (pTrigger?1:0)) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0,
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab,
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
   && !pParse->bReturning
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
      if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
        sqlite3VdbeChangeP3(v, -1, memCnt ? memCnt : -1);
      }
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK;
    if( sNC.ncFlags & NC_VarSelect ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      nPk = 1;
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }

    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0,0,wcf,iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
    if( sqlite3WhereUsesDeferredSeek(pWInfo) ){
      sqlite3VdbeAddOp1(v, OP_FinishSeek, iTabCur);
    }

    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }

    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }

    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
      addrBypass = sqlite3VdbeMakeLabel(pParse);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
      sqlite3WhereEnd(pWInfo);
    }

    /* Unless this is a view, open cursors for the table we are
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ){
        sqlite3VdbeJumpHereOrPopInst(v, iAddrOnce);
      }
    }

    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || IsView(pTab) );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }

    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3CodeChangeCount(v, memCnt, "rows deleted");
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  sqlite3DbFree(db, aToOpen);
  return;
}